

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O2

OpenFileInfo * __thiscall
duckdb::SimpleMultiFileList::GetFile
          (OpenFileInfo *__return_storage_ptr__,SimpleMultiFileList *this,idx_t i)

{
  pointer pOVar1;
  pointer pOVar2;
  const_reference pvVar3;
  allocator local_31;
  string local_30;
  
  pOVar1 = (this->super_MultiFileList).paths.
           super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar2 = (this->super_MultiFileList).paths.
           super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pOVar1 == pOVar2) || ((ulong)(((long)pOVar2 - (long)pOVar1) / 0x30) <= i)) {
    ::std::__cxx11::string::string((string *)&local_30,anon_var_dwarf_4b71df5 + 9,&local_31);
    OpenFileInfo::OpenFileInfo(__return_storage_ptr__,&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    pvVar3 = vector<duckdb::OpenFileInfo,_true>::get<true>(&(this->super_MultiFileList).paths,i);
    OpenFileInfo::OpenFileInfo(__return_storage_ptr__,pvVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

OpenFileInfo SimpleMultiFileList::GetFile(idx_t i) {
	if (paths.empty() || i >= paths.size()) {
		return OpenFileInfo("");
	}

	return paths[i];
}